

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetTXPassiveStray(ndicapi *pol,int i,double *coord)

{
  char *cp;
  long lVar1;
  int local_34;
  int n;
  char *dp;
  double *coord_local;
  int i_local;
  ndicapi *pol_local;
  
  if (pol->TxPassiveStray[0] == '\0') {
    pol_local._4_4_ = 1;
  }
  else {
    local_34 = pol->TxPassiveStrayCount;
    if (local_34 < 0) {
      pol_local._4_4_ = 2;
    }
    else {
      if (0x32 < local_34) {
        local_34 = 0x32;
      }
      if ((i < 0) || (local_34 <= i)) {
        pol_local._4_4_ = 2;
      }
      else {
        cp = pol->TxPassiveStray + i * 0x15;
        lVar1 = ndiSignedToLong(cp,7);
        *coord = (double)lVar1 * 0.01;
        lVar1 = ndiSignedToLong(cp + 7,7);
        coord[1] = (double)lVar1 * 0.01;
        lVar1 = ndiSignedToLong(cp + 0xe,7);
        coord[2] = (double)lVar1 * 0.01;
        pol_local._4_4_ = 0;
      }
    }
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetTXPassiveStray(ndicapi* pol, int i, double coord[3])
{
  const char* dp;
  int n;

  dp = pol->TxPassiveStray;

  if (*dp == '\0')
  {
    return NDI_DISABLED;
  }

  n = pol->TxPassiveStrayCount;
  if (n < 0)
  {
    return NDI_MISSING;
  }
  if (n > 50)
  {
    n = 50;
  }

  if (i < 0 || i >= n)
  {
    return NDI_MISSING;
  }

  dp += 7 * 3 * i;
  coord[0] = ndiSignedToLong(&dp[0],  7) * 0.01;
  coord[1] = ndiSignedToLong(&dp[7],  7) * 0.01;
  coord[2] = ndiSignedToLong(&dp[14], 7) * 0.01;

  return NDI_OKAY;
}